

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
* pstore::command_line::details::get_option_and_value
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
             *__return_storage_ptr__,string *arg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  string local_c0 [32];
  pstore local_a0 [32];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_80;
  ulong local_58;
  size_t equal_pos;
  undefined1 local_40 [8];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  string *arg_local;
  
  value.storage_._24_8_ = arg;
  nothing<std::__cxx11::string>();
  bVar1 = starts_with(arg,"--");
  if (bVar1) {
    local_58 = std::__cxx11::string::find((char)arg,0x3d);
    if (local_58 == 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)arg,0);
    }
    else {
      std::__cxx11::string::substr((ulong)local_a0,(ulong)arg);
      just<std::__cxx11::string>(&local_80,local_a0,value_00);
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      operator=((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 *)local_40,&local_80);
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      ~maybe(&local_80);
      std::__cxx11::string::~string((string *)local_a0);
      if (local_58 < 2) {
        assert_failed("equal_pos >= double_dash_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                      ,0x69);
      }
      std::__cxx11::string::substr((ulong)local_c0,(ulong)arg);
      std::__cxx11::string::operator=((string *)arg,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
  }
  else {
    bVar1 = starts_with(arg,"-");
    if (!bVar1) {
      assert_failed("starts_with (arg, \"-\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                    ,0x6d);
    }
    std::__cxx11::string::erase((ulong)arg,0);
  }
  std::make_tuple<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&>
            (__return_storage_ptr__,arg,
             (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)local_40);
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  ~maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, maybe<std::string>> get_option_and_value (std::string arg) {
                    static constexpr char double_dash[] = "--";
                    static constexpr auto double_dash_len = std::string::size_type{2};

                    auto value = nothing<std::string> ();
                    if (starts_with (arg, double_dash)) {
                        std::size_t const equal_pos = arg.find ('=', double_dash_len);
                        if (equal_pos == std::string::npos) {
                            arg.erase (0U, double_dash_len);
                        } else {
                            value = just (arg.substr (equal_pos + 1, std::string::npos));
                            PSTORE_ASSERT (equal_pos >= double_dash_len);
                            arg = arg.substr (double_dash_len, equal_pos - double_dash_len);
                        }
                    } else {
                        PSTORE_ASSERT (starts_with (arg, "-"));
                        arg.erase (0U, 1U);
                    }
                    return std::make_tuple (arg, value);
                }